

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void InsertInterval(CostManager *manager,CostInterval *interval_in,int64_t cost,int position,
                   int start,int end)

{
  CostInterval *previous;
  int in_ECX;
  int64_t in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  CostInterval *interval_new;
  int64_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  
  if (in_R8D < in_R9D) {
    if (*(int *)(in_RDI + 8) < 500) {
      if (*(long *)(in_RDI + 0x81b8) == 0) {
        if (*(long *)(in_RDI + 0x81c0) == 0) {
          previous = (CostInterval *)
                     WebPSafeMalloc(CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                                    in_stack_ffffffffffffffd0);
          if (previous == (CostInterval *)0x0) {
            UpdateCostPerInterval
                      ((CostManager *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,0,
                       in_stack_ffffffffffffffc8);
            return;
          }
        }
        else {
          previous = *(CostInterval **)(in_RDI + 0x81c0);
          *(CostInterval **)(in_RDI + 0x81c0) = previous->next_;
        }
      }
      else {
        previous = *(CostInterval **)(in_RDI + 0x81b8);
        *(CostInterval **)(in_RDI + 0x81b8) = previous->next_;
      }
      previous->cost_ = in_RDX;
      previous->index_ = in_ECX;
      previous->start_ = in_R8D;
      previous->end_ = in_R9D;
      PositionOrphanInterval
                ((CostManager *)CONCAT44(in_ECX,in_R8D),
                 (CostInterval *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),previous);
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
    }
    else {
      UpdateCostPerInterval
                ((CostManager *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
                 (int)(in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       int64_t cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count_ >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals_ != NULL) {
    interval_new = manager->free_intervals_;
    manager->free_intervals_ = interval_new->next_;
  } else if (manager->recycled_intervals_ != NULL) {
    interval_new = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval_new->next_;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost_ = cost;
  interval_new->index_ = position;
  interval_new->start_ = start;
  interval_new->end_ = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count_;
}